

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtxParams_getParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int *value)

{
  uint *in_RDX;
  int in_ESI;
  uint *in_RDI;
  
  if (in_ESI == 10) {
    *in_RDX = *in_RDI;
  }
  else if (in_ESI == 100) {
    *in_RDX = in_RDI[0xb];
  }
  else if (in_ESI == 0x65) {
    *in_RDX = in_RDI[1];
  }
  else if (in_ESI == 0x66) {
    *in_RDX = in_RDI[3];
  }
  else if (in_ESI == 0x67) {
    *in_RDX = in_RDI[2];
  }
  else if (in_ESI == 0x68) {
    *in_RDX = in_RDI[4];
  }
  else if (in_ESI == 0x69) {
    *in_RDX = in_RDI[5];
  }
  else if (in_ESI == 0x6a) {
    *in_RDX = in_RDI[6];
  }
  else if (in_ESI == 0x6b) {
    *in_RDX = in_RDI[7];
  }
  else if (in_ESI == 0xa0) {
    *in_RDX = in_RDI[0x18];
  }
  else if (in_ESI == 0xa1) {
    *in_RDX = in_RDI[0x19];
  }
  else if (in_ESI == 0xa2) {
    *in_RDX = in_RDI[0x1b];
  }
  else if (in_ESI == 0xa3) {
    *in_RDX = in_RDI[0x1a];
  }
  else if (in_ESI == 0xa4) {
    *in_RDX = in_RDI[0x1c];
  }
  else if (in_ESI == 200) {
    *in_RDX = in_RDI[8];
  }
  else if (in_ESI == 0xc9) {
    *in_RDX = in_RDI[9];
  }
  else if (in_ESI == 0xca) {
    *in_RDX = (uint)((in_RDI[10] != 0 ^ 0xffU) & 1);
  }
  else if (in_ESI == 400) {
    *in_RDX = in_RDI[0x13];
  }
  else if (in_ESI == 0x191) {
    if (0x7fffffff < *(ulong *)(in_RDI + 0x14)) {
      __assert_fail("CCtxParams->jobSize <= INT_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x54ef,
                    "size_t ZSTD_CCtxParams_getParameter(const ZSTD_CCtx_params *, ZSTD_cParameter, int *)"
                   );
    }
    *in_RDX = (uint)*(undefined8 *)(in_RDI + 0x14);
  }
  else if (in_ESI == 0x192) {
    *in_RDX = in_RDI[0x16];
  }
  else if (in_ESI == 500) {
    *in_RDX = in_RDI[0x17];
  }
  else if (in_ESI == 1000) {
    *in_RDX = in_RDI[0xc];
  }
  else if (in_ESI == 0x3e9) {
    *in_RDX = in_RDI[0x11];
  }
  else if (in_ESI == 0x3ea) {
    *in_RDX = in_RDI[0x12];
  }
  else if (in_ESI == 0x3eb) {
    *in_RDX = (uint)*(undefined8 *)(in_RDI + 0xe);
  }
  else if (in_ESI == 0x3ec) {
    *in_RDX = in_RDI[0x10];
  }
  else if (in_ESI == 0x3ed) {
    *in_RDX = in_RDI[0x1e];
  }
  else if (in_ESI == 0x3ee) {
    *in_RDX = in_RDI[0x1f];
  }
  else if (in_ESI == 0x3ef) {
    *in_RDX = in_RDI[0x20];
  }
  else if (in_ESI == 0x3f0) {
    *in_RDX = in_RDI[0x21];
  }
  else if (in_ESI == 0x3f1) {
    *in_RDX = in_RDI[0x22];
  }
  else if (in_ESI == 0x3f2) {
    *in_RDX = in_RDI[0x23];
  }
  else if (in_ESI == 0x3f3) {
    *in_RDX = in_RDI[0x24];
  }
  else if (in_ESI == 0x3f4) {
    *in_RDX = in_RDI[0x25];
  }
  else if (in_ESI == 0x3f5) {
    *in_RDX = in_RDI[0x2c];
  }
  else if (in_ESI == 0x3f6) {
    *in_RDX = in_RDI[0x2d];
  }
  else if (in_ESI == 0x3f7) {
    *in_RDX = (uint)*(undefined8 *)(in_RDI + 0x30);
  }
  else {
    if (in_ESI != 0x3f8) {
      return 0xffffffffffffffd8;
    }
    *in_RDX = in_RDI[0x32];
  }
  return 0;
}

Assistant:

size_t ZSTD_CCtxParams_getParameter(
        ZSTD_CCtx_params const* CCtxParams, ZSTD_cParameter param, int* value)
{
    switch(param)
    {
    case ZSTD_c_format :
        *value = CCtxParams->format;
        break;
    case ZSTD_c_compressionLevel :
        *value = CCtxParams->compressionLevel;
        break;
    case ZSTD_c_windowLog :
        *value = (int)CCtxParams->cParams.windowLog;
        break;
    case ZSTD_c_hashLog :
        *value = (int)CCtxParams->cParams.hashLog;
        break;
    case ZSTD_c_chainLog :
        *value = (int)CCtxParams->cParams.chainLog;
        break;
    case ZSTD_c_searchLog :
        *value = CCtxParams->cParams.searchLog;
        break;
    case ZSTD_c_minMatch :
        *value = CCtxParams->cParams.minMatch;
        break;
    case ZSTD_c_targetLength :
        *value = CCtxParams->cParams.targetLength;
        break;
    case ZSTD_c_strategy :
        *value = (unsigned)CCtxParams->cParams.strategy;
        break;
    case ZSTD_c_contentSizeFlag :
        *value = CCtxParams->fParams.contentSizeFlag;
        break;
    case ZSTD_c_checksumFlag :
        *value = CCtxParams->fParams.checksumFlag;
        break;
    case ZSTD_c_dictIDFlag :
        *value = !CCtxParams->fParams.noDictIDFlag;
        break;
    case ZSTD_c_forceMaxWindow :
        *value = CCtxParams->forceWindow;
        break;
    case ZSTD_c_forceAttachDict :
        *value = CCtxParams->attachDictPref;
        break;
    case ZSTD_c_literalCompressionMode :
        *value = CCtxParams->literalCompressionMode;
        break;
    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        assert(CCtxParams->nbWorkers == 0);
#endif
        *value = CCtxParams->nbWorkers;
        break;
    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        assert(CCtxParams->jobSize <= INT_MAX);
        *value = (int)CCtxParams->jobSize;
        break;
#endif
    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        *value = CCtxParams->overlapLog;
        break;
#endif
    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR(parameter_unsupported, "not compiled with multithreading");
#else
        *value = CCtxParams->rsyncable;
        break;
#endif
    case ZSTD_c_enableDedicatedDictSearch :
        *value = CCtxParams->enableDedicatedDictSearch;
        break;
    case ZSTD_c_enableLongDistanceMatching :
        *value = CCtxParams->ldmParams.enableLdm;
        break;
    case ZSTD_c_ldmHashLog :
        *value = CCtxParams->ldmParams.hashLog;
        break;
    case ZSTD_c_ldmMinMatch :
        *value = CCtxParams->ldmParams.minMatchLength;
        break;
    case ZSTD_c_ldmBucketSizeLog :
        *value = CCtxParams->ldmParams.bucketSizeLog;
        break;
    case ZSTD_c_ldmHashRateLog :
        *value = CCtxParams->ldmParams.hashRateLog;
        break;
    case ZSTD_c_targetCBlockSize :
        *value = (int)CCtxParams->targetCBlockSize;
        break;
    case ZSTD_c_srcSizeHint :
        *value = (int)CCtxParams->srcSizeHint;
        break;
    case ZSTD_c_stableInBuffer :
        *value = (int)CCtxParams->inBufferMode;
        break;
    case ZSTD_c_stableOutBuffer :
        *value = (int)CCtxParams->outBufferMode;
        break;
    case ZSTD_c_blockDelimiters :
        *value = (int)CCtxParams->blockDelimiters;
        break;
    case ZSTD_c_validateSequences :
        *value = (int)CCtxParams->validateSequences;
        break;
    case ZSTD_c_useBlockSplitter :
        *value = (int)CCtxParams->useBlockSplitter;
        break;
    case ZSTD_c_useRowMatchFinder :
        *value = (int)CCtxParams->useRowMatchFinder;
        break;
    case ZSTD_c_deterministicRefPrefix:
        *value = (int)CCtxParams->deterministicRefPrefix;
        break;
    case ZSTD_c_prefetchCDictTables:
        *value = (int)CCtxParams->prefetchCDictTables;
        break;
    case ZSTD_c_enableSeqProducerFallback:
        *value = CCtxParams->enableMatchFinderFallback;
        break;
    case ZSTD_c_maxBlockSize:
        *value = (int)CCtxParams->maxBlockSize;
        break;
    case ZSTD_c_searchForExternalRepcodes:
        *value = (int)CCtxParams->searchForExternalRepcodes;
        break;
    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
    return 0;
}